

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_X86.cpp
# Opt level: O0

void __thiscall ExecutorX86::ClearNative(ExecutorX86 *this)

{
  x86Instruction *dst;
  int iVar1;
  uint uVar2;
  ExpiredCodeBlock *pEVar3;
  ExpiredFunctionAddressList *pEVar4;
  ExpiredFunctionAddressList *info;
  uint i_1;
  ExpiredCodeBlock *block;
  undefined1 local_30 [4];
  uint i;
  TraceScope traceScope;
  ExecutorX86 *this_local;
  
  if (ClearNative()::token == '\0') {
    iVar1 = __cxa_guard_acquire(&ClearNative()::token);
    if (iVar1 != 0) {
      ClearNative::token = NULLC::TraceGetToken("x86","ClearNative");
      __cxa_guard_release(&ClearNative()::token);
    }
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_30,ClearNative::token);
  uVar2 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
  if (uVar2 != 0) {
    dst = (this->instList).data;
    uVar2 = FastVector<x86Instruction,_true,_true>::size(&this->instList);
    NULLC::fillMemory(dst,0,(ulong)uVar2 * 0x50);
  }
  FastVector<x86Instruction,_true,_true>::clear(&this->instList);
  this->binCodeSize = 0;
  this->lastInstructionCount = 0;
  FastVector<unsigned_int,_false,_false>::clear(&this->globalCodeRanges);
  block._4_4_ = 0;
  while( true ) {
    uVar2 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::size(&this->expiredCodeBlocks);
    if (uVar2 <= block._4_4_) break;
    pEVar3 = FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::operator[]
                       (&this->expiredCodeBlocks,block._4_4_);
    NULLC::MemProtect(pEVar3->code,pEVar3->codeSize,3);
    (*(code *)NULLC::dealloc)(pEVar3->code);
    block._4_4_ = block._4_4_ + 1;
  }
  FastVector<ExecutorX86::ExpiredCodeBlock,_false,_false>::clear(&this->expiredCodeBlocks);
  info._4_4_ = 0;
  while( true ) {
    uVar2 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::size
                      (&this->expiredFunctionAddressLists);
    if (uVar2 <= info._4_4_) break;
    pEVar4 = FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::operator[]
                       (&this->expiredFunctionAddressLists,info._4_4_);
    (*(code *)NULLC::dealloc)(pEVar4->data);
    info._4_4_ = info._4_4_ + 1;
  }
  FastVector<ExecutorX86::ExpiredFunctionAddressList,_false,_false>::clear
            (&this->expiredFunctionAddressLists);
  this->oldJumpTargetCount = 0;
  this->oldRegKillInfoCount = 0;
  this->oldFunctionSize = 0;
  if (this->codeGenCtx != (CodeGenRegVmContext *)0x0) {
    NULLC::destruct<CodeGenRegVmContext>(this->codeGenCtx);
  }
  this->codeGenCtx = (CodeGenRegVmContext *)0x0;
  this->codeRunning = false;
  NULLC::TraceScope::~TraceScope((TraceScope *)local_30);
  return;
}

Assistant:

void ExecutorX86::ClearNative()
{
	TRACE_SCOPE("x86", "ClearNative");

	if (instList.size())
		NULLC::fillMemory(instList.data, 0, sizeof(x86Instruction) * instList.size());
	instList.clear();

	binCodeSize = 0;
	lastInstructionCount = 0;

	globalCodeRanges.clear();

	for(unsigned i = 0; i < expiredCodeBlocks.size(); i++)
	{
		ExpiredCodeBlock &block = expiredCodeBlocks[i];

#ifndef __linux
		DWORD unusedProtect;
		VirtualProtect((void*)block.code, block.codeSize, oldCodeBodyProtect, &unusedProtect);
#else
		NULLC::MemProtect((void*)block.code, block.codeSize, PROT_READ | PROT_WRITE);
#endif

		NULLC::dealloc(block.code);

#if defined(_M_X64) && !defined(__linux)
		if(block.unwindTable)
		{
			RtlDeleteFunctionTable(block.unwindTable);
			NULLC::dealloc(block.unwindTable);
		}
#endif
	}

	expiredCodeBlocks.clear();

	for(unsigned i = 0; i < expiredFunctionAddressLists.size(); i++)
	{
		ExpiredFunctionAddressList &info = expiredFunctionAddressLists[i];

		NULLC::dealloc(info.data);
	}
	expiredFunctionAddressLists.clear();

#if defined(_M_X64) && !defined(__linux)
	// Remove function table for unwind information
	if(!functionWin64UnwindTable.empty())
		RtlDeleteFunctionTable(functionWin64UnwindTable.data);

	functionWin64UnwindTable.clear();
#endif

	oldJumpTargetCount = 0;
	oldRegKillInfoCount = 0;
	oldFunctionSize = 0;

	// Create new code generation context
	if(codeGenCtx)
		NULLC::destruct(codeGenCtx);
	codeGenCtx = NULL;

	codeRunning = false;
}